

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_hash_set * ggml_hash_set_new(ggml_hash_set *__return_storage_ptr__,size_t size)

{
  size_t __size;
  ggml_tensor **ppgVar1;
  ggml_bitset_t *pgVar2;
  size_t l;
  ulong uVar3;
  int line;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  
  uVar5 = 0;
  uVar3 = 0x20;
  do {
    uVar4 = uVar3 + uVar5 >> 1;
    if (ggml_hash_size::primes[uVar4] < size) {
      uVar5 = uVar4 + 1;
      uVar4 = uVar3;
    }
    uVar3 = uVar4;
  } while (uVar5 < uVar4);
  if (uVar5 < 0x20) {
    sVar6 = ggml_hash_size::primes[uVar5];
  }
  else {
    sVar6 = size | 1;
  }
  __return_storage_ptr__->size = sVar6;
  __size = sVar6 * 8;
  if (__size == 0) {
    ppgVar1 = (ggml_tensor **)0x0;
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_malloc!\n");
  }
  else {
    ppgVar1 = (ggml_tensor **)malloc(__size);
    if (ppgVar1 == (ggml_tensor **)0x0) {
      auVar7._8_4_ = (int)(__size >> 0x20);
      auVar7._0_8_ = __size;
      auVar7._12_4_ = 0x45300000;
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %6.2f MB\n",
                        ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)__size) - 4503599627370496.0)) *
                        9.5367431640625e-07,"ggml_malloc");
      line = 0x144;
      goto LAB_0011ff60;
    }
  }
  __return_storage_ptr__->keys = ppgVar1;
  if (sVar6 + 0x1f < 0x20) {
    pgVar2 = (ggml_bitset_t *)0x0;
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_calloc!\n");
  }
  else {
    pgVar2 = (ggml_bitset_t *)calloc(sVar6 + 0x1f >> 5,4);
    if (pgVar2 == (ggml_bitset_t *)0x0) {
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %6.2f MB\n",0x3ed0000000000000,
                        "ggml_calloc");
      line = 0x152;
LAB_0011ff60:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 line,"fatal error");
    }
  }
  __return_storage_ptr__->used = pgVar2;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_hash_set ggml_hash_set_new(size_t size) {
    size = ggml_hash_size(size);
    struct ggml_hash_set result;
    result.size = size;
    result.keys = GGML_MALLOC(sizeof(struct ggml_tensor *) * size);
    result.used = GGML_CALLOC(ggml_bitset_size(size), sizeof(ggml_bitset_t));
    return result;
}